

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdTest888(void)

{
  word *pTruth_00;
  int Status;
  int i;
  word *pTruth;
  char *pStr;
  char local_7d8 [4];
  int nVars;
  char pDsd [2000];
  
  pTruth_00 = Dau_DsdToTruth("(<abc>(<def><ghi>))",9);
  Dau_DsdDecompose(pTruth_00,9,0,0,local_7d8);
  return;
}

Assistant:

void Dau_DsdTest888()
{
    char pDsd[DAU_MAX_STR];
    int nVars = 9;
//    char * pStr = "[(abc)(def)(ghi)]";
//    char * pStr = "[a!b!(c!d[e(fg)hi])]";
//    char * pStr = "[(abc)(def)]";
//    char * pStr = "[(abc)(def)]";
//    char * pStr = "[abcdefg]";
//    char * pStr = "[<abc>(de[ghi])]";
    char * pStr = "(<abc>(<def><ghi>))";
    word * pTruth = Dau_DsdToTruth( pStr, 9 );
    int i, Status;
//    Kit_DsdPrintFromTruth( (unsigned *)pTruth, 9 ); printf( "\n" );
/*
    for ( i = 0; i < 6; i++ )
    {
        unsigned uSupp = Dau_Dsd6FindSupports( NULL, pTruth, NULL, 6, i );
        Dau_DsdPrintSupports( uSupp, 6 );
    }
*/
/*
    printf( "\n" );
    for ( i = 0; i < nVars; i++ )
    {
        unsigned uSupp = Dau_DsdFindSupports( NULL, pTruth, NULL, nVars, i );
        Dau_DsdPrintSupports( uSupp, nVars );
    }
*/
    Status = Dau_DsdDecompose( pTruth, nVars, 0, 0, pDsd );
    i = 0;
}